

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O2

void matras_gh_1145_test(void)

{
  void *pvVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined1 local_a0 [8];
  matras local;
  matras_view view;
  matras_id_t id;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_gh_1145_test");
  plan(1);
  extents_in_use = 0;
  matras_create((matras *)local_a0,8,&ver_allocator,(matras_stats *)0x0);
  matras_create_read_view((matras *)local_a0,(matras_view *)&local.stats);
  pvVar1 = matras_alloc((matras *)local_a0,(matras_id_t *)((long)&view.next_view + 4));
  if (pvVar1 == (void *)0x0) {
    pcVar2 = "matras_alloc(&local, &id) != NULL";
    uVar3 = 0x111;
  }
  else {
    pvVar1 = matras_touch((matras *)local_a0,view.next_view._4_4_);
    if (pvVar1 != (void *)0x0) {
      matras_destroy_read_view((matras *)local_a0,(matras_view *)&local.stats);
      matras_destroy((matras *)local_a0);
      _ok((uint)(extents_in_use == 0),"extents_in_use == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x115
          ,"line %d",0x115);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_gh_1145_test");
      check_plan();
      return;
    }
    pcVar2 = "matras_touch(&local, id) != NULL";
    uVar3 = 0x112;
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar2,"false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",uVar3
          ,"matras_gh_1145_test");
  exit(-1);
}

Assistant:

void
matras_gh_1145_test()
{
	header();
	plan(1);

	struct matras local;
	extents_in_use = 0;
	matras_create(&local, sizeof(type_t), &ver_allocator, NULL);
	struct matras_view view;
	matras_create_read_view(&local, &view);
	matras_id_t id;
	fail_unless(matras_alloc(&local, &id) != NULL);
	fail_unless(matras_touch(&local, id) != NULL);
	matras_destroy_read_view(&local, &view);
	matras_destroy(&local);
	ok(extents_in_use == 0);

	footer();
	check_plan();
}